

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configreader.cpp
# Opt level: O2

bool __thiscall ConfigReader::parsePad(ConfigReader *this)

{
  bool bVar1;
  bool bVar2;
  token_t tVar3;
  ConfigReader *this_00;
  string cellname;
  string location;
  string instance;
  string tokstr;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL> items;
  allocator<char> local_143;
  allocator<char> local_142;
  allocator<char> local_141;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  undefined1 local_a0 [64];
  string local_60 [32];
  ConfigReader local_40;
  
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  local_e0._M_string_length = 0;
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  local_100._M_string_length = 0;
  local_e0.field_2._M_local_buf[0] = '\0';
  local_100.field_2._M_local_buf[0] = '\0';
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  local_120._M_string_length = 0;
  local_120.field_2._M_local_buf[0] = '\0';
  tVar3 = tokenize(this,&local_e0);
  if (tVar3 == TOK_IDENT) {
    tVar3 = tokenize(this,&local_100);
    if (tVar3 == TOK_IDENT) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_a0,"N",(allocator<char> *)&local_140);
      std::__cxx11::string::string<std::allocator<char>>((string *)(local_a0 + 0x20),"E",&local_143)
      ;
      std::__cxx11::string::string<std::allocator<char>>(local_60,"S",&local_141);
      this_00 = &local_40;
      std::__cxx11::string::string<std::allocator<char>>((string *)this_00,"W",&local_142);
      bVar1 = inArray(this_00,&local_100,
                      (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                       *)local_a0);
      if (bVar1) {
        tVar3 = tokenize(this,&local_120);
        if (tVar3 != TOK_IDENT) {
LAB_001244cd:
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_140,"Expected a cell name\n",&local_143);
          error(this,&local_140);
          goto LAB_00124515;
        }
        bVar2 = std::operator==(&local_120,"FLIP");
        if (bVar2) {
          tVar3 = tokenize(this,&local_120);
          if (tVar3 != TOK_IDENT) goto LAB_001244cd;
        }
        tVar3 = tokenize(this,&local_c0);
        if (tVar3 != TOK_SEMICOL) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_140,"Expected ;\n",&local_143);
          error(this,&local_140);
          goto LAB_00124515;
        }
        this->m_padCount = this->m_padCount + 1;
        bVar1 = true;
        (*this->_vptr_ConfigReader[3])(this,&local_e0,&local_100,&local_120,(ulong)bVar2);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_140,"Expected a pad location to be one of N/E/S/W\n",&local_143)
        ;
        error(this,&local_140);
LAB_00124515:
        std::__cxx11::string::~string((string *)&local_140);
        bVar1 = false;
      }
      std::
      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>::
      ~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
              *)local_a0);
      goto LAB_0012452e;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_a0,"Expected a location\n",(allocator<char> *)&local_140);
    error(this,(string *)local_a0);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_a0,"Expected an instance name\n",(allocator<char> *)&local_140);
    error(this,(string *)local_a0);
  }
  std::__cxx11::string::~string((string *)local_a0);
  bVar1 = false;
LAB_0012452e:
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  return bVar1;
}

Assistant:

bool ConfigReader::parsePad()
{
    // PAD: instance location cellname
    std::string tokstr;
    std::string instance;
    std::string location;
    std::string cellname;
    bool flipped = false;

    // instance name
    ConfigReader::token_t tok = tokenize(instance);
    if (tok != TOK_IDENT)
    {
        error("Expected an instance name\n");
        return false;
    }

    // location name
    tok = tokenize(location);
    if (tok != TOK_IDENT)
    {
        error("Expected a location\n");
        return false;
    }

    // PADs can only be on North, South, East or West
    std::array<std::string, 4> items = {"N","E","S","W"};
    if (!inArray(location, items))
    {
        error("Expected a pad location to be one of N/E/S/W\n");
        return false;
    }

    // parse optional 'FLIP' argument for flipped cells
    tok = tokenize(cellname);
    if ((tok == TOK_IDENT) && (cellname == "FLIP"))
    {
        flipped = true;
        tok = tokenize(cellname);
    }

    // cell name    
    if (tok != TOK_IDENT)
    {
        error("Expected a cell name\n");
        return false;
    }

    // expect semicol
    tok = tokenize(tokstr);
    if (tok != TOK_SEMICOL)
    {
        error("Expected ;\n");
        return false;
    }

    m_padCount++;
    onPad(instance,location,cellname,flipped);

    return true;
}